

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

private_dispatcher_handle_t __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::create_private_disp
          (one_per_prio *this,environment_t *env,string *data_sources_name_base,
          disp_params_t *params)

{
  atomic_refcounted_t *paVar1;
  real_private_dispatcher_t *this_00;
  disp_params_t local_50;
  
  this_00 = (real_private_dispatcher_t *)operator_new(0x18);
  disp_params_t::disp_params_t(&local_50,params);
  impl::real_private_dispatcher_t::real_private_dispatcher_t
            (this_00,env,data_sources_name_base,&local_50);
  *(real_private_dispatcher_t **)this = this_00;
  LOCK();
  paVar1 = &(this_00->super_private_dispatcher_t).super_atomic_refcounted_t;
  (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
       (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  std::_Function_base::~_Function_base((_Function_base *)&local_50.m_queue_params);
  return (private_dispatcher_handle_t)(private_dispatcher_t *)this;
}

Assistant:

SO_5_FUNC private_dispatcher_handle_t
create_private_disp(
	environment_t & env,
	const std::string & data_sources_name_base,
	disp_params_t params )
	{
		return private_dispatcher_handle_t(
				new impl::real_private_dispatcher_t{
						env,
						data_sources_name_base,
						std::move(params) } );
	}